

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O2

void add_obj_and_parts(Am_Object *orig,Am_Value_List *new_parts,int *maxobjw,int *maxobjh)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object new_obj;
  Am_Value_List parts;
  Am_Object sub_obj;
  Am_Object local_68;
  Am_Draw_Method fade_method;
  Am_Draw_Method agg_method;
  Am_Draw_Method method;
  
  pAVar3 = Am_Object::Get(orig,2000,0);
  Am_Draw_Method::Am_Draw_Method(&method,pAVar3);
  pAVar3 = Am_Object::Get(&Am_Aggregate,2000,0);
  Am_Draw_Method::Am_Draw_Method(&agg_method,pAVar3);
  pAVar3 = Am_Object::Get(&Am_Fade_Group,2000,0);
  Am_Draw_Method::Am_Draw_Method(&fade_method,pAVar3);
  new_obj.data = (Am_Object_Data *)0x0;
  if ((method.from_wrapper != agg_method.from_wrapper) &&
     (method.from_wrapper != fade_method.from_wrapper)) {
    Am_Object::Copy_Value_Only((Am_Object *)&parts,(char *)orig);
    Am_Object::operator=(&new_obj,(Am_Object *)&parts);
    Am_Object::~Am_Object((Am_Object *)&parts);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&new_obj);
    Am_Value_List::Add(new_parts,pAVar4,Am_TAIL,true);
    pAVar3 = Am_Object::Get(orig,0x66,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    if (*maxobjw < iVar2) {
      *maxobjw = iVar2;
    }
    pAVar3 = Am_Object::Get(orig,0x67,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    if (*maxobjh < iVar2) {
      *maxobjh = iVar2;
    }
  }
  sub_obj.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Is_Group_Or_Map(orig);
  if (bVar1) {
    bVar1 = Am_Object::Valid(&new_obj);
    if (bVar1) {
      Am_Value_List::Am_Value_List(&parts);
      pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&parts);
      Am_Object::Set(&new_obj,0x82,pAVar4,0);
      Am_Value_List::~Am_Value_List(&parts);
    }
    pAVar3 = Am_Object::Get(orig,0x82,0);
    Am_Value_List::Am_Value_List(&parts,pAVar3);
    Am_Value_List::Start(&parts);
    while( true ) {
      bVar1 = Am_Value_List::Last(&parts);
      if (bVar1) break;
      pAVar3 = Am_Value_List::Get(&parts);
      Am_Object::operator=(&sub_obj,pAVar3);
      Am_Object::Am_Object(&local_68,&Am_Graphical_Object);
      bVar1 = Am_Object::Is_Instance_Of(&sub_obj,&local_68);
      Am_Object::~Am_Object(&local_68);
      if (bVar1) {
        add_obj_and_parts(&sub_obj,new_parts,maxobjw,maxobjh);
      }
      Am_Value_List::Next(&parts);
    }
    Am_Value_List::~Am_Value_List(&parts);
  }
  Am_Object::~Am_Object(&sub_obj);
  Am_Object::~Am_Object(&new_obj);
  return;
}

Assistant:

void
add_obj_and_parts(Am_Object &orig, Am_Value_List &new_parts, int &maxobjw,
                  int &maxobjh)
{
  //don't add parts that use the regular aggregate draw method, since
  //it draws all subparts anyway.  This includes regular Maps and Groups
  Am_Draw_Method method = orig.Get(Am_DRAW_METHOD);
  Am_Draw_Method agg_method = Am_Aggregate.Get(Am_DRAW_METHOD);
  Am_Draw_Method fade_method = Am_Fade_Group.Get(Am_DRAW_METHOD);
  Am_Object new_obj;
  if (method != agg_method && method != fade_method) {
    new_obj = orig.Copy_Value_Only();
    new_parts.Add(new_obj);
    int wh = orig.Get(Am_WIDTH);
    if (wh > maxobjw)
      maxobjw = wh;
    wh = orig.Get(Am_HEIGHT);
    if (wh > maxobjh)
      maxobjh = wh;
  }
  Am_Object sub_obj;
  if (Am_Is_Group_Or_Map(orig)) {
    //flatten out the parts
    //can't use graphical_parts list because it is computed by a
    //constraint which has been removed
    if (new_obj.Valid())
      new_obj.Set(Am_GRAPHICAL_PARTS, Am_Value_List()); //make it empty in copy
    Am_Value_List parts = orig.Get(Am_GRAPHICAL_PARTS);
    for (parts.Start(); !parts.Last(); parts.Next()) {
      sub_obj = parts.Get();
      if (sub_obj.Is_Instance_Of(Am_Graphical_Object))
        add_obj_and_parts(sub_obj, new_parts, maxobjw, maxobjh);
    }
  }
}